

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDataCacheWrapper.cpp
# Opt level: O1

HRESULT __thiscall Js::SimpleDataCacheWrapper::SaveWriteStream(SimpleDataCacheWrapper *this)

{
  return -0x7fffbffb;
}

Assistant:

HRESULT SimpleDataCacheWrapper::SaveWriteStream()
    {
        HRESULT hr = E_FAIL;

#ifdef ENABLE_WININET_PROFILE_DATA_CACHE
        if (IsWriteStreamOpen())
        {
#if DBG
            STATSTG statstg = { 0 };
            hr = this->outStream->Stat(&statstg, STATFLAG_DEFAULT);
            if (FAILED(hr))
            {
                OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Failed to call IStream::Stat on write stream (hr = 0x%08lx)\n"), hr);
            }
#endif
            OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Attempting to save write stream with %u bytes...\n"), statstg.cbSize.LowPart);

            Assert(this->dataCache != nullptr);
            hr = this->dataCache->SaveWriteDataStream(this->outStream);

            this->outStream->Release();
            this->outStream = nullptr;

            if (FAILED(hr))
            {
                OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Failed to save write stream (hr = 0x%08lx)\n"), hr);
            }
            else
            {
                OUTPUT_TRACE_DEBUGONLY(Js::DataCachePhase, _u(" Successfully saved write stream\n"), hr);
            }
        }
#endif

        return hr;
    }